

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

void Ses_ManPrintFuncs(Ses_Man_t *pSes)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  FILE *__stream;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong *puVar9;
  ulong *puVar10;
  long lVar11;
  long lVar12;
  
  printf("find optimum circuit for %d %d-variable functions:\n",(ulong)(uint)pSes->nSpecFunc,
         (ulong)(uint)pSes->nSpecVars);
  if (0 < pSes->nSpecFunc) {
    lVar8 = 0;
    do {
      lVar1 = lVar8 + 1;
      printf("  func %d: ");
      __stream = _stdout;
      uVar4 = pSes->nSpecVars;
      if ((int)uVar4 < 2) {
        __assert_fail("nVars >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                      ,0x4dc,"void Abc_TtPrintHexRev(FILE *, word *, int)");
      }
      puVar10 = pSes->pSpec + ((int)lVar8 << 2);
      iVar5 = 1 << ((char)uVar4 - 6U & 0x1f);
      if (uVar4 < 7) {
        iVar5 = 1;
      }
      puVar9 = puVar10 + (long)iVar5 + -1;
      if (puVar10 <= puVar9) {
        uVar3 = ~(-1 << ((char)uVar4 - 2U & 0x1f));
        if (5 < (int)uVar4) {
          uVar3 = 0xf;
        }
        lVar8 = (ulong)uVar3 + 1;
        lVar12 = (ulong)uVar3 << 2;
        lVar6 = lVar8;
        lVar11 = lVar12;
        do {
          uVar4 = (uint)(*puVar9 >> ((byte)lVar11 & 0x3c)) & 0xf;
          iVar5 = uVar4 + 0x30;
          if (9 < uVar4) {
            iVar5 = uVar4 + 0x37;
          }
          fputc(iVar5,__stream);
          lVar7 = lVar6 + -1;
          bVar2 = 0 < lVar6;
          lVar6 = lVar7;
          lVar11 = lVar11 + -4;
        } while ((lVar7 != 0 && bVar2) ||
                (puVar9 = puVar9 + -1, lVar6 = lVar8, lVar11 = lVar12, puVar10 <= puVar9));
      }
      putchar(10);
      lVar8 = lVar1;
    } while (lVar1 < pSes->nSpecFunc);
  }
  if ((pSes->nMaxDepth != -1) && (printf("  max depth = %d\n"), pSes->pArrTimeProfile != (int *)0x0)
     ) {
    printf("  arrival times =");
    if (0 < pSes->nSpecVars) {
      lVar8 = 0;
      do {
        printf(" %d",(ulong)(uint)pSes->pArrTimeProfile[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar8 < pSes->nSpecVars);
    }
    putchar(10);
    return;
  }
  return;
}

Assistant:

static inline void Ses_ManPrintFuncs( Ses_Man_t * pSes )
{
    int h;

    printf( "find optimum circuit for %d %d-variable functions:\n", pSes->nSpecFunc, pSes->nSpecVars );
    for ( h = 0; h < pSes->nSpecFunc; ++h )
    {
        printf( "  func %d: ", h + 1 );
        Abc_TtPrintHexRev( stdout, &pSes->pSpec[h << 2], pSes->nSpecVars );
        printf( "\n" );
    }

    if ( pSes->nMaxDepth != -1 )
    {
        printf( "  max depth = %d\n", pSes->nMaxDepth );
        if ( pSes->pArrTimeProfile )
        {
            printf( "  arrival times =" );
            for ( h = 0; h < pSes->nSpecVars; ++h )
                printf( " %d", pSes->pArrTimeProfile[h] );
            printf( "\n" );
        }
    }
}